

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::BeginDockableDragDropSource(ImGuiWindow *window)

{
  float fVar1;
  ImGuiContext *pIVar2;
  bool bVar3;
  ImGuiContext *g;
  ImGuiWindow *local_18;
  ImRect local_10;
  
  pIVar2 = GImGui;
  if (GImGui->ActiveId != window->MoveId) {
    __assert_fail("g.ActiveId == window->MoveId",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                  ,0x3a9e,"void ImGui::BeginDockableDragDropSource(ImGuiWindow *)");
  }
  if (GImGui->MovingWindow == window) {
    (window->DC).LastItemId = GImGui->ActiveId;
    local_18 = window->RootWindow;
    if ((local_18->Flags & 0x200000) != 0) {
      __assert_fail("(window->Flags & ImGuiWindowFlags_NoDocking) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                    ,0x3aa3,"void ImGui::BeginDockableDragDropSource(ImGuiWindow *)");
    }
    if ((pIVar2->IO).ConfigDockingWithShift == false) {
      local_10.Max.x = (local_18->SizeFull).x;
      fVar1 = (pIVar2->Style).FramePadding.y;
      local_10.Max.y = fVar1 + fVar1 + pIVar2->FontSize;
      local_10.Min.x = 0.0;
      local_10.Min.y = 0.0;
      bVar3 = ImRect::Contains(&local_10,&pIVar2->ActiveIdClickOffset);
      if (!bVar3) {
        return;
      }
    }
    bVar3 = BeginDragDropSource(0x25);
    if (bVar3) {
      SetDragDropPayload("_IMWINDOW",&local_18,8,0);
      EndDragDropSource();
    }
    return;
  }
  __assert_fail("g.MovingWindow == window",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                ,0x3a9f,"void ImGui::BeginDockableDragDropSource(ImGuiWindow *)");
}

Assistant:

void ImGui::BeginDockableDragDropSource(ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.ActiveId == window->MoveId);
    IM_ASSERT(g.MovingWindow == window);

    window->DC.LastItemId = window->MoveId;
    window = window->RootWindow;
    IM_ASSERT((window->Flags & ImGuiWindowFlags_NoDocking) == 0);
    bool is_drag_docking = (g.IO.ConfigDockingWithShift) || ImRect(0, 0, window->SizeFull.x, GetFrameHeight()).Contains(g.ActiveIdClickOffset);
    if (is_drag_docking && BeginDragDropSource(ImGuiDragDropFlags_SourceNoPreviewTooltip | ImGuiDragDropFlags_SourceNoHoldToOpenOthers | ImGuiDragDropFlags_SourceAutoExpirePayload))
    {
        SetDragDropPayload(IMGUI_PAYLOAD_TYPE_WINDOW, &window, sizeof(window));
        EndDragDropSource();
    }
}